

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Checks.h
# Opt level: O2

bool UnitTest::ArrayAreClose<float[2],float_const*,float>
               (float (*expected) [2],float **actual,int count,float *tolerance)

{
  bool bVar1;
  ulong uVar2;
  ulong uVar3;
  
  uVar2 = 0;
  uVar3 = (ulong)(uint)count;
  if (count < 1) {
    uVar3 = uVar2;
  }
  bVar1 = true;
  for (; uVar3 != uVar2; uVar2 = uVar2 + 1) {
    bVar1 = (bool)(bVar1 & -((*actual)[uVar2] <= (*expected)[uVar2] + *tolerance) &
                           -((*expected)[uVar2] - *tolerance <= (*actual)[uVar2]));
  }
  return bVar1;
}

Assistant:

bool ArrayAreClose(Expected const& expected, Actual const& actual, int const count, Tolerance const& tolerance)
{
    bool equal = true;
    for (int i = 0; i < count; ++i)
        equal &= AreClose(expected[i], actual[i], tolerance);
    return equal;
}